

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O2

void __thiscall
sznet::detail::ThreadData::ThreadData
          (ThreadData *this,ThreadFunc *func,string *name,sz_pid_t *tid,CountDownLatch *latch)

{
  std::function<void_()>::function(&this->m_func,func);
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  this->m_tid = tid;
  this->m_latch = latch;
  return;
}

Assistant:

ThreadData(ThreadFunc func, const string& name, sz_pid_t* tid, CountDownLatch* latch):
		m_func(std::move(func)),
		m_name(name),
		m_tid(tid),
		m_latch(latch)
	{ 
	}